

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.cpp
# Opt level: O1

size_t __thiscall embree::LineSegments::getGeometryDataDeviceByteSize(LineSegments *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (ulong)(this->super_Geometry).numTimeSteps * 0x38;
  lVar3 = lVar2 + 0x1a0;
  if ((this->vertices).size_active == 0) {
    lVar3 = 0x1a0;
  }
  lVar1 = 8;
  if ((this->normals).size_active != 0) {
    lVar1 = lVar2 + 0xf;
  }
  return lVar1 + lVar3 & 0xfffffffffffffff0;
}

Assistant:

size_t LineSegments::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(LineSegments);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }